

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef crec_tv_ct(jit_State *J,CType *s,CTypeID sid,TRef sp)

{
  uint uVar1;
  CTState *cts_00;
  ushort uVar2;
  IRRef1 IVar3;
  IRType IVar4;
  TRef TVar5;
  TRef TVar6;
  TRef TVar7;
  TRef TVar8;
  ulong u64;
  TRef dp;
  TRef tr2;
  TRef tr1;
  TRef ptr;
  ptrdiff_t esz;
  TRef tr;
  CTInfo sinfo;
  IRType t;
  CTState *cts;
  TRef sp_local;
  CTypeID sid_local;
  CType *s_local;
  jit_State *J_local;
  
  cts_00 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  IVar4 = crec_ct2irt(cts_00,s);
  uVar1 = s->info;
  IVar3 = (IRRef1)sp;
  uVar2 = (ushort)IVar4;
  cts._4_4_ = sid;
  if (uVar1 >> 0x1c == 0) {
    if (IVar4 == IRT_CDATA) {
LAB_001b0188:
      lj_trace_err(J,LJ_TRERR_NYICONV);
    }
    (J->fold).ins.field_0.ot = uVar2 | 0x4600;
    (J->fold).ins.field_0.op1 = IVar3;
    (J->fold).ins.field_0.op2 = 0;
    cts._0_4_ = lj_opt_fold(J);
    if ((IVar4 == IRT_FLOAT) || (IVar4 == IRT_U32)) {
      (J->fold).ins.field_0.ot = 0x5b0e;
      (J->fold).ins.field_0.op1 = (IRRef1)(TRef)cts;
      (J->fold).ins.field_0.op2 = uVar2 | 0x1c0;
      TVar5 = lj_opt_fold(J);
      return TVar5;
    }
    if ((IVar4 != IRT_I64) && (IVar4 != IRT_U64)) {
      if ((uVar1 & 0x8000000) == 0) {
        return (TRef)cts;
      }
      TVar5 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x993;
      (J->fold).ins.field_0.op1 = (IRRef1)(TRef)cts;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      J->postproc = LJ_POST_FIXGUARD;
      return 0x2007ffd;
    }
  }
  else if ((uVar1 >> 0x1c == 2) || (uVar1 >> 0x1c == 5)) {
    (J->fold).ins.field_0.ot = uVar2 | 0x4600;
    (J->fold).ins.field_0.op1 = IVar3;
    (J->fold).ins.field_0.op2 = 0;
    cts._0_4_ = lj_opt_fold(J);
  }
  else {
    if (((uVar1 & 0xfc000000) != 0x30000000) && (uVar1 >> 0x1c != 1)) {
      if ((uVar1 & 0xf4000000) == 0x34000000) {
        u64 = (ulong)(s->size >> 1);
        TVar5 = lj_ir_kint(J,sid);
        (J->fold).ins.field_0.ot = 0x538a;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
        (J->fold).ins.field_0.op2 = 0x7fff;
        TVar5 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = uVar2 | 0x4600;
        (J->fold).ins.field_0.op1 = IVar3;
        (J->fold).ins.field_0.op2 = 0;
        TVar6 = lj_opt_fold(J);
        TVar7 = lj_ir_kint64(J,u64);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = IVar3;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        TVar7 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = uVar2 | 0x4600;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
        (J->fold).ins.field_0.op2 = 0;
        TVar7 = lj_opt_fold(J);
        TVar8 = lj_ir_kint64(J,0x10);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
        TVar8 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = uVar2 | 0x4e00;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
        lj_opt_fold(J);
        TVar6 = lj_ir_kint64(J,u64 + 0x10);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
        TVar6 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = uVar2 | 0x4e00;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        lj_opt_fold(J);
        return TVar5;
      }
      goto LAB_001b0188;
    }
    cts_00->L = J->L;
    cts._4_4_ = lj_ctype_intern(cts_00,sid + 0x22830000,8);
    cts._0_4_ = sp;
  }
  TVar5 = lj_ir_kint(J,cts._4_4_);
  (J->fold).ins.field_0.ot = 0x548a;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
  (J->fold).ins.field_0.op2 = (IRRef1)(TRef)cts;
  TVar5 = lj_opt_fold(J);
  return TVar5;
}

Assistant:

static TRef crec_tv_ct(jit_State *J, CType *s, CTypeID sid, TRef sp)
{
  CTState *cts = ctype_ctsG(J2G(J));
  IRType t = crec_ct2irt(cts, s);
  CTInfo sinfo = s->info;
  if (ctype_isnum(sinfo)) {
    TRef tr;
    if (t == IRT_CDATA)
      goto err_nyi;  /* NYI: copyval of >64 bit integers. */
    tr = emitir(IRT(IR_XLOAD, t), sp, 0);
    if (t == IRT_FLOAT || t == IRT_U32) {  /* Keep uint32_t/float as numbers. */
      return emitconv(tr, IRT_NUM, t, 0);
    } else if (t == IRT_I64 || t == IRT_U64) {  /* Box 64 bit integer. */
      sp = tr;
      lj_needsplit(J);
    } else if ((sinfo & CTF_BOOL)) {
      /* Assume not equal to zero. Fixup and emit pending guard later. */
      lj_ir_set(J, IRTGI(IR_NE), tr, lj_ir_kint(J, 0));
      J->postproc = LJ_POST_FIXGUARD;
      return TREF_TRUE;
    } else {
      return tr;
    }
  } else if (ctype_isptr(sinfo) || ctype_isenum(sinfo)) {
    sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Box pointers and enums. */
  } else if (ctype_isrefarray(sinfo) || ctype_isstruct(sinfo)) {
    cts->L = J->L;
    sid = lj_ctype_intern(cts, CTINFO_REF(sid), CTSIZE_PTR);  /* Create ref. */
  } else if (ctype_iscomplex(sinfo)) {  /* Unbox/box complex. */
    ptrdiff_t esz = (ptrdiff_t)(s->size >> 1);
    TRef ptr, tr1, tr2, dp;
    dp = emitir(IRTG(IR_CNEW, IRT_CDATA), lj_ir_kint(J, sid), TREF_NIL);
    tr1 = emitir(IRT(IR_XLOAD, t), sp, 0);
    ptr = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, esz));
    tr2 = emitir(IRT(IR_XLOAD, t), ptr, 0);
    ptr = emitir(IRT(IR_ADD, IRT_PTR), dp, lj_ir_kintp(J, sizeof(GCcdata)));
    emitir(IRT(IR_XSTORE, t), ptr, tr1);
    ptr = emitir(IRT(IR_ADD, IRT_PTR), dp, lj_ir_kintp(J, sizeof(GCcdata)+esz));
    emitir(IRT(IR_XSTORE, t), ptr, tr2);
    return dp;
  } else {
    /* NYI: copyval of vectors. */
  err_nyi:
    lj_trace_err(J, LJ_TRERR_NYICONV);
  }
  /* Box pointer, ref, enum or 64 bit integer. */
  return emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, sid), sp);
}